

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O0

void routine2(void *arg)

{
  int sock;
  int local_18;
  int i;
  int s;
  void *arg_local;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                          ,0x3e,1,0x51);
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                      ,0x41,sock,"ipc://test-shutdown.ipc");
  }
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                   ,0x45,sock,"hello");
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                  ,0x48,sock);
  active = active + -1;
  return;
}

Assistant:

static void routine2 (NN_UNUSED void *arg)
{
    int s;
    int i;

    s = test_socket (AF_SP, NN_PULL);

    for (i = 0; i < 10; ++i) {
        test_connect (s, SOCKET_ADDRESS);
    }

    for (i = 0; i < MESSAGES_PER_THREAD; ++i) {
        test_recv (s, "hello");
    }

    test_close (s);
    active --;
}